

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::AssignFromValue::AssignFromValue
          (AssignFromValue *this,CodeLocation *l,Expression *dest,Expression *src)

{
  pool_ptr<soul::heart::Expression> local_40;
  CodeLocation local_38;
  Expression *local_28;
  Expression *src_local;
  Expression *dest_local;
  CodeLocation *l_local;
  AssignFromValue *this_local;
  
  local_28 = src;
  src_local = dest;
  dest_local = (Expression *)l;
  l_local = (CodeLocation *)this;
  CodeLocation::CodeLocation(&local_38,l);
  pool_ptr<soul::heart::Expression>::pool_ptr<soul::heart::Expression,void>(&local_40,src_local);
  Assignment::Assignment(&this->super_Assignment,&local_38,&local_40);
  pool_ptr<soul::heart::Expression>::~pool_ptr(&local_40);
  CodeLocation::~CodeLocation(&local_38);
  (this->super_Assignment).super_Statement.super_Object._vptr_Object =
       (_func_int **)&PTR__AssignFromValue_00641040;
  pool_ref<soul::heart::Expression>::pool_ref<soul::heart::Expression,void>(&this->source,local_28);
  return;
}

Assistant:

AssignFromValue (CodeLocation l, Expression& dest, Expression& src)
            : Assignment (std::move (l), dest), source (src) {}